

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void neon_load_reg32(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,int reg)

{
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)(var + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(reg << 2 & 4) + ((ulong)(reg << 2 & 8) | (ulong)((uint)reg >> 2) << 8)
                      + 0xc10);
  return;
}

Assistant:

static inline long vfp_reg_offset(bool dp, unsigned reg)
{
    if (dp) {
        return offsetof(CPUARMState, vfp.zregs[reg >> 1].d[reg & 1]);
    } else {
        long ofs = offsetof(CPUARMState, vfp.zregs[reg >> 2].d[(reg >> 1) & 1]);
        if (reg & 1) {
            ofs += offsetof(CPU_DoubleU, l.upper);
        } else {
            ofs += offsetof(CPU_DoubleU, l.lower);
        }
        return ofs;
    }
}